

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbinaryast.cpp
# Opt level: O2

void __thiscall SQASTReader::readTableBody(SQASTReader *this,TableDecl *table)

{
  uint64_t uVar1;
  Expr *key;
  Expr *value;
  uint64_t uVar2;
  bool bVar3;
  
  uVar1 = InputStream::readVaruint(this->stream);
  ArenaVector<SQCompilation::TableMember>::resize(&table->_members,(size_type_conflict)uVar1);
  while (bVar3 = uVar1 != 0, uVar1 = uVar1 - 1, bVar3) {
    key = readExpression(this);
    value = readExpression(this);
    uVar2 = InputStream::readVaruint(this->stream);
    SQCompilation::TableDecl::addMember(table,key,value,(uint)uVar2);
  }
  return;
}

Assistant:

void SQASTReader::readTableBody(TableDecl *table) {
  size_t size = stream->readUIntptr();
  table->members().resize(size);

  for (size_t i = 0; i < size; ++i) {
    Expr *key = readExpression();
    Expr *value = readExpression();
    unsigned flags = stream->readUInt32();

    table->addMember(key, value, flags);
  }
}